

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O1

void Abc_EnumerateFunctions(int nDecMax)

{
  ulong uVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *p_00;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  int level;
  uint Entry;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int nFuncs;
  int nVars;
  timespec ts;
  int nMints;
  int GateCount [100];
  int FuncDone [100];
  uint pFuncs [100];
  uint pVars [100];
  uint pMints [100];
  int local_8ac;
  ulong local_890;
  uint local_870;
  int local_86c;
  long local_868;
  ulong local_860;
  ulong local_858;
  long local_850;
  timespec local_848;
  ulong local_838;
  ulong local_830;
  ulong local_828;
  ulong local_820;
  ulong local_818;
  uint local_80c [101];
  int local_678 [100];
  uint local_4e8 [100];
  uint local_358 [100];
  uint local_1c8 [102];
  
  memset(local_358,0,400);
  memset(local_1c8,0,400);
  memset(local_4e8,0,400);
  memset(local_678,0,400);
  memset(local_80c + 1,0,400);
  iVar6 = clock_gettime(3,&local_848);
  if (iVar6 < 0) {
    local_868 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_848.tv_nsec),8);
    local_868 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_848.tv_sec * -1000000;
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100000;
  p->nSize = 0;
  piVar7 = (int *)malloc(400000);
  p->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400000);
  p_00->pArray = piVar7;
  Abc_GetSecond(&local_86c,(int *)local_80c,(int *)&local_870,local_358,local_1c8,local_4e8);
  if ((local_80c[0] != 0x10) && (local_80c[0] != 0x20)) {
    __assert_fail("nMints == 16 || nMints == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                  ,0x153,"void Abc_EnumerateFunctions(int)");
  }
  __ptr = calloc((ulong)(uint)(1 << ((char)local_80c[0] - 3U & 0x1f)),1);
  local_850 = (long)local_86c;
  if (0 < local_850) {
    lVar8 = 0;
    do {
      uVar12 = local_358[lVar8];
      puVar2 = (ulong *)((long)__ptr + (ulong)(uVar12 >> 6) * 8);
      *puVar2 = *puVar2 ^ (long)(1 << ((byte)uVar12 & 0x1f));
      Vec_IntPush(p_00,uVar12);
      Vec_IntPush(p,-1);
      Vec_IntPush(p,-1);
      lVar8 = lVar8 + 1;
    } while (local_850 != lVar8);
  }
  local_80c[1] = 0;
  local_80c[2] = local_86c;
  if (p_00->nSize != local_86c) {
    __assert_fail("Vec_IntSize(vTruths) == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                  ,0x163,"void Abc_EnumerateFunctions(int)");
  }
  if (0 < (int)local_870 && 0 < nDecMax) {
    local_838 = (ulong)(uint)nDecMax;
    local_890 = 1;
    local_8ac = 0;
    uVar11 = 0;
    do {
      uVar1 = uVar11 + 1;
      uVar9 = 0;
      local_830 = uVar11;
      do {
        local_860 = uVar9 + 1;
        local_828 = uVar9;
        do {
          uVar11 = local_828;
          local_820 = uVar9;
          if (uVar9 + local_828 == local_830) {
            printf("Trying %d + %d + 1 = %d\n",local_828 & 0xffffffff,uVar9 & 0xffffffff,
                   uVar1 & 0xffffffff);
            uVar12 = local_80c[uVar11 + 1];
            uVar3 = local_80c[local_860 + 1];
            if ((int)uVar12 < (int)uVar3) {
              uVar4 = local_80c[uVar9 + 1];
              uVar5 = local_80c[uVar9 + 2];
              do {
                if ((int)uVar4 < (int)uVar5) {
                  local_858 = (ulong)uVar12;
                  Entry = uVar4;
                  do {
                    if ((int)uVar12 < (int)Entry) {
                      if (((((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) || ((int)Entry < 0))
                         || (p_00->nSize <= (int)Entry)) {
LAB_00414976:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                      }
                      local_818 = (ulong)Entry;
                      uVar10 = p_00->pArray[local_818] & p_00->pArray[local_858];
                      uVar11 = *(ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8);
                      uVar9 = (ulong)(1 << ((byte)uVar10 & 0x1f));
                      if ((uVar11 & uVar9) == 0) {
                        *(ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8) = uVar11 ^ uVar9;
                        Vec_IntPush(p_00,uVar10);
                        Vec_IntPush(p,uVar12);
                        Vec_IntPush(p,Entry);
                        uVar11 = 0;
                        do {
                          if ((local_678[uVar11] == 0) && (uVar10 == local_4e8[uVar11])) {
                            printf("Found function %d with %d gates: ",uVar11 & 0xffffffff,uVar1);
                            Abc_EnumPrint(p,p_00->nSize + -1,(int)local_850);
                            local_678[uVar11] = 1;
                            local_8ac = local_8ac + 1;
                          }
                          uVar11 = uVar11 + 1;
                        } while (local_870 != uVar11);
                      }
                      if ((p_00->nSize <= (int)uVar12) || (p_00->nSize <= (int)Entry))
                      goto LAB_00414976;
                      uVar10 = p_00->pArray[local_818] | p_00->pArray[local_858];
                      uVar11 = *(ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8);
                      uVar9 = (ulong)(1 << ((byte)uVar10 & 0x1f));
                      if ((uVar11 & uVar9) == 0) {
                        *(ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8) = uVar11 ^ uVar9;
                        Vec_IntPush(p_00,uVar10);
                        Vec_IntPush(p,Entry);
                        Vec_IntPush(p,uVar12);
                        uVar11 = 0;
                        do {
                          if ((local_678[uVar11] == 0) && (uVar10 == local_4e8[uVar11])) {
                            printf("Found function %d with %d gates: ",uVar11 & 0xffffffff,uVar1);
                            Abc_EnumPrint(p,p_00->nSize + -1,(int)local_850);
                            local_678[uVar11] = 1;
                            local_8ac = local_8ac + 1;
                          }
                          uVar11 = uVar11 + 1;
                        } while (local_870 != uVar11);
                      }
                    }
                    Entry = Entry + 1;
                  } while (Entry != uVar5);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar3);
            }
          }
          uVar9 = local_820 + 1;
        } while (uVar9 != local_890);
        uVar9 = local_860;
      } while (local_860 != local_890);
      local_678[local_830 - 0x62] = p_00->nSize;
      printf("Finished %d gates.  Truths = %10d.  ",uVar1 & 0xffffffff);
      level = 3;
      iVar6 = clock_gettime(3,&local_848);
      if (iVar6 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_848.tv_nsec / 1000 + local_848.tv_sec * 1000000;
      }
      lVar8 = lVar8 + local_868;
      Abc_Print(level,"%s =","Time");
      Abc_Print(level,"%9.2f sec\n",(double)lVar8 / 1000000.0);
    } while ((uVar1 < local_838) &&
            (local_890 = local_890 + 1, uVar11 = uVar1, local_8ac < (int)local_870));
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Abc_EnumerateFunctions( int nDecMax )
{
    int nVars;
    int nMints;
    int nFuncs;
    unsigned pVars[100] = {0};
    unsigned pMints[100] = {0};
    unsigned pFuncs[100] = {0};
    unsigned Truth;
    int FuncDone[100] = {0}, nFuncDone = 0;
    int GateCount[100] = {0};
    int i, k, n, a, b, v;
    abctime clk = Abc_Clock();
    Vec_Int_t * vGates = Vec_IntAlloc( 100000 );
    Vec_Int_t * vTruths = Vec_IntAlloc( 100000 );
//    Vec_Int_t * vHash = Vec_IntStartFull( 1 << 16 );
    word * pHash;

    // extract data
//    Abc_GetFirst( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
    Abc_GetSecond( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
//    Abc_GetThird( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );

    // create hash table
    assert( nMints == 16 || nMints == 32 );
    pHash = (word *)ABC_CALLOC( char, 1 << (nMints-3) );

    // create elementary gates
    for ( k = 0; k < nVars; k++ )
    {
//        Vec_IntWriteEntry( vHash, pVars[k], k );
        Abc_DataXorBit( pHash, pVars[k] );
        Vec_IntPush( vTruths, pVars[k] );
        Vec_IntPush( vGates, -1 );
        Vec_IntPush( vGates, -1 );
    }

    // go through different number of variables
    GateCount[0] = 0;
    GateCount[1] = nVars;
    assert( Vec_IntSize(vTruths) == nVars );
    for ( n = 0; n < nDecMax && nFuncDone < nFuncs; n++ )
    {
        for ( a = 0; a <= n; a++ )
        for ( b = a; b <= n; b++ )
        if ( a + b == n )
        {
            printf( "Trying %d + %d + 1 = %d\n", a, b, n+1 );
            for ( i = GateCount[a]; i < GateCount[a+1]; i++ )
            for ( k = GateCount[b]; k < GateCount[b+1]; k++ )
            if ( i < k )
            {
                Truth = Vec_IntEntry(vTruths, i) & Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, i );
                    Vec_IntPush( vGates, k );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
                Truth = Vec_IntEntry(vTruths, i) | Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, k );
                    Vec_IntPush( vGates, i );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
            }
        }
        GateCount[n+2] = Vec_IntSize(vTruths);
        printf( "Finished %d gates.  Truths = %10d.  ", n+1, Vec_IntSize(vTruths) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    ABC_FREE( pHash );
//    Vec_IntFree( vHash );
    Vec_IntFree( vGates );
    Vec_IntFree( vTruths );
}